

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjDecompressHeader3(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int *width,int *height
                       ,int *jpegSubsamp,int *jpegColorspace)

{
  j_decompress_ptr cinfo;
  uint uVar1;
  int iVar2;
  tjinstance *this;
  char *__src;
  size_t __n;
  long *in_FS_OFFSET;
  undefined1 auVar3 [16];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    __src = "tjDecompressHeader3(): Instance has not been initialized for decompression";
LAB_0010e88c:
    __n = 0x4b;
LAB_0010e892:
    memcpy((void *)((long)handle + 0x608),__src,__n);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),__src,__n);
  }
  else {
    auVar3._0_4_ = -(uint)(jpegBuf == (uchar *)0x0);
    auVar3._4_4_ = -(uint)(width == (int *)0x0);
    auVar3._8_4_ = -(uint)(height == (int *)0x0);
    auVar3._12_4_ = -(uint)(jpegSubsamp == (int *)0x0);
    iVar2 = movmskps((int)jpegSize,auVar3);
    if ((jpegColorspace != (int *)0x0 && jpegSize != 0) && iVar2 == 0) {
      iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar2 != 0) {
        return -1;
      }
      cinfo = (j_decompress_ptr)((long)handle + 0x208);
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      jpeg_read_header(cinfo,1);
      *width = *(int *)((long)handle + 0x238);
      *height = *(int *)((long)handle + 0x23c);
      iVar2 = getSubsamp(cinfo);
      *jpegSubsamp = iVar2;
      uVar1 = *(int *)((long)handle + 0x244) - 1;
      iVar2 = -1;
      if (uVar1 < 5) {
        iVar2 = *(int *)(&DAT_00161d28 + (ulong)uVar1 * 4);
      }
      *jpegColorspace = iVar2;
      jpeg_abort_decompress(cinfo);
      if (*jpegSubsamp < 0) {
        __src = "tjDecompressHeader3(): Could not determine subsampling type for JPEG image";
        goto LAB_0010e88c;
      }
      if (-1 < *jpegColorspace) {
        if ((0 < *width) && (uVar1 = 0, 0 < *height)) goto LAB_0010e9b1;
        builtin_strncpy((char *)((long)handle + 0x628),"ata retu",8);
        builtin_strncpy((char *)((long)handle + 0x630),"rned in ",8);
        builtin_strncpy((char *)((long)handle + 0x618),"er3(): I",8);
        builtin_strncpy((char *)((long)handle + 0x620),"nvalid d",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
        builtin_strncpy((char *)((long)handle + 0x610),"ressHead",8);
        *(undefined8 *)((long)handle + 0x637) = 0x72656461656820;
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        *(undefined8 *)((long)in_FS_OFFSET + -0xa1) = 0x72656461656820;
        in_FS_OFFSET[-0x16] = 0x7574657220617461;
        in_FS_OFFSET[-0x15] = 0x206e692064656e72;
        in_FS_OFFSET[-0x18] = 0x49203a2928337265;
        in_FS_OFFSET[-0x17] = 0x642064696c61766e;
        in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
        in_FS_OFFSET[-0x19] = 0x6461654873736572;
        goto LAB_0010e9ac;
      }
      __src = "tjDecompressHeader3(): Could not determine colorspace of JPEG image";
      __n = 0x44;
      goto LAB_0010e892;
    }
    builtin_strncpy((char *)((long)handle + 0x618),"er3(): I",8);
    builtin_strncpy((char *)((long)handle + 0x620),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ressHead",8);
    *(undefined8 *)((long)handle + 0x628) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    in_FS_OFFSET[-0x16] = 0x746e656d756772;
    in_FS_OFFSET[-0x18] = 0x49203a2928337265;
    in_FS_OFFSET[-0x17] = 0x612064696c61766e;
    in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
    in_FS_OFFSET[-0x19] = 0x6461654873736572;
  }
LAB_0010e9ac:
  uVar1 = 0xffffffff;
LAB_0010e9b1:
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar1;
}

Assistant:

DLLEXPORT int tjDecompressHeader3(tjhandle handle,
                                  const unsigned char *jpegBuf,
                                  unsigned long jpegSize, int *width,
                                  int *height, int *jpegSubsamp,
                                  int *jpegColorspace)
{
  int retval = 0;

  GET_DINSTANCE(handle);
  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressHeader3(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || width == NULL || height == NULL ||
      jpegSubsamp == NULL || jpegColorspace == NULL)
    THROW("tjDecompressHeader3(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    return -1;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);

  *width = dinfo->image_width;
  *height = dinfo->image_height;
  *jpegSubsamp = getSubsamp(dinfo);
  switch (dinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:  *jpegColorspace = TJCS_GRAY;  break;
  case JCS_RGB:        *jpegColorspace = TJCS_RGB;  break;
  case JCS_YCbCr:      *jpegColorspace = TJCS_YCbCr;  break;
  case JCS_CMYK:       *jpegColorspace = TJCS_CMYK;  break;
  case JCS_YCCK:       *jpegColorspace = TJCS_YCCK;  break;
  default:             *jpegColorspace = -1;  break;
  }

  jpeg_abort_decompress(dinfo);

  if (*jpegSubsamp < 0)
    THROW("tjDecompressHeader3(): Could not determine subsampling type for JPEG image");
  if (*jpegColorspace < 0)
    THROW("tjDecompressHeader3(): Could not determine colorspace of JPEG image");
  if (*width < 1 || *height < 1)
    THROW("tjDecompressHeader3(): Invalid data returned in header");

bailout:
  if (this->jerr.warning) retval = -1;
  return retval;
}